

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

int Gia_ManFindSharedNode(Gia_Man_t *pNew,Vec_Int_t *vSuper,int iLit0)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  
  if ((long)vSuper->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar6 = vSuper->pArray[(long)vSuper->nSize + -1];
  if ((int)uVar6 < 0) {
LAB_0067ace8:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar8 = uVar6 >> 1;
  pVVar2 = pNew->vLevels;
  Vec_IntFillExtra(pVVar2,uVar8 + 1,0);
  if (pVVar2->nSize <= (int)uVar8) {
LAB_0067acc9:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = pVVar2->pArray[uVar8];
  uVar4 = (ulong)(uint)vSuper->nSize;
  do {
    uVar7 = uVar4;
    iVar9 = (int)uVar7;
    if (iVar9 < 1) goto LAB_0067aca7;
    if (vSuper->nSize < iVar9) goto LAB_0067acc9;
    uVar8 = vSuper->pArray[uVar7 - 1];
    if ((int)uVar8 < 0) goto LAB_0067ace8;
    uVar10 = uVar8 >> 1;
    pVVar2 = pNew->vLevels;
    Vec_IntFillExtra(pVVar2,uVar10 + 1,0);
    if (pVVar2->nSize <= (int)uVar10) goto LAB_0067acc9;
    if (iVar1 != pVVar2->pArray[uVar10]) goto LAB_0067aca7;
    if (iLit0 < 0) goto LAB_0067ace8;
    if ((uint)iLit0 >> 1 == uVar10) break;
    iVar5 = Gia_ManHashLookupInt(pNew,iLit0,uVar8);
    uVar4 = uVar7 - 1;
  } while (iVar5 == 0);
  if (uVar8 != uVar6) {
    if (iVar9 <= vSuper->nSize) {
      piVar3 = vSuper->pArray;
      piVar3[uVar7 - 1] = uVar6;
      if (0 < (long)vSuper->nSize) {
        piVar3[(long)vSuper->nSize + -1] = uVar8;
        goto LAB_0067aca7;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_0067aca7:
  if (0 < vSuper->nSize) {
    uVar6 = vSuper->nSize - 1;
    vSuper->nSize = uVar6;
    return vSuper->pArray[uVar6];
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
}

Assistant:

int Gia_ManFindSharedNode( Gia_Man_t * pNew, Vec_Int_t * vSuper, int iLit0 )
{
    int i, iLit1 = Vec_IntEntryLast(vSuper);
    // iterate through the nodes whose level is equal to that of the last one
    int iLit1Level = Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit1));
    for ( i = Vec_IntSize(vSuper)-1; i >= 0; i-- )
    {
        int iLit2 = Vec_IntEntry(vSuper, i);
        if ( iLit1Level != Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit2)) )
            break;
        if ( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit2) && !Gia_ManHashLookupInt(pNew, iLit0, iLit2) ) // new node
            continue;
        // swap iLit2 and iLit1
        if ( iLit2 != iLit1 )
        {
            Vec_IntWriteEntry( vSuper, i, iLit1 );
            Vec_IntWriteEntry( vSuper, Vec_IntSize(vSuper)-1, iLit2 );
        }
        break;
    }
    return Vec_IntPop(vSuper);    
}